

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_appendADynArray_success_zeroSizeSrcArray_fn(int _i)

{
  bool bVar1;
  int iVar2;
  void *array;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  private_ACUtilsTest_ADynArray_CharArray destArray;
  
  destArray.buffer = (char *)0x0;
  destArray.reallocator._0_4_ = 0x10a480;
  destArray.reallocator._4_4_ = 0;
  destArray.deallocator._0_4_ = 0x10a4c0;
  destArray.deallocator._4_4_ = 0;
  destArray.size = 5;
  destArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
  destArray.capacity = 8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_50 = 0x116806;
  destArray.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  builtin_strncpy(destArray.buffer,"0123",5);
  uStack_50 = 0x11681f;
  array = private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  uStack_50 = 0x116847;
  bVar1 = private_ACUtils_ADynArray_insertArray(&destArray,0xffffffffffffffff,array,0,1);
  if (bVar1 == true) {
    uStack_50 = 0x116861;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x5fc);
    if (destArray.size == 5) {
      uStack_50 = 0x116881;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x5fd);
      if (destArray.capacity == 8) {
        uStack_50 = 0x1168a1;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x5fe);
        if (destArray.buffer == (char *)0x0) {
          ppcVar6 = &local_58;
          pcVar4 = "Assertion \'_ck_x != NULL\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %#x";
          pcVar7 = "(void*) destArray.buffer != NULL";
          pcVar8 = "(void*) destArray.buffer";
          iVar2 = 0x5ff;
LAB_00116b98:
          uStack_50 = 0;
          local_58 = (char *)0x0;
          *(code **)((long)ppcVar6 + -8) =
               test_ADynArray_appendADynArray_failure_bufferExpansionFailed_fn;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,iVar2,pcVar4,pcVar3,pcVar7,pcVar8);
        }
        uStack_50 = 0x1168be;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x5ff);
        pcStack_80 = destArray.buffer;
        if (destArray.buffer == (char *)0x0) {
          pcVar3 = "";
          pcStack_80 = "(null)";
        }
        else {
          uStack_50 = 0x1168db;
          iVar2 = strcmp("0123",destArray.buffer);
          if (iVar2 == 0) {
            uStack_50 = 0x1168f4;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x600);
            if (destArray.growStrategy == (ACUtilsGrowStrategy)0x0) {
              ppcVar6 = &local_58;
              pcVar4 = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar7 = "(void*) destArray.growStrategy != NULL";
              pcVar8 = "(void*) destArray.growStrategy";
              iVar2 = 0x601;
            }
            else {
              uStack_50 = 0x116914;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x601);
              uStack_50 = 0x116921;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x602);
              uStack_50 = 0x11692e;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x603);
              if (array == (void *)0x0) {
                ppcVar6 = &local_58;
                pcVar4 = "Assertion \'_ck_x != NULL\' failed";
                pcVar3 = "Assertion \'%s\' failed: %s == %#x";
                pcVar7 = "(void*) srcArray.buffer != NULL";
                pcVar8 = "(void*) srcArray.buffer";
                iVar2 = 0x604;
              }
              else {
                uStack_50 = 0x11694b;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x604);
                uStack_50 = 0x116958;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x605);
                if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                  uStack_50 = 0x116979;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                              ,0x606);
                  uStack_50 = 0x116982;
                  (*(code *)CONCAT44(destArray.deallocator._4_4_,destArray.deallocator._0_4_))
                            (destArray.buffer);
                  private_ACUtilsTest_ADynArray_freeCount =
                       private_ACUtilsTest_ADynArray_freeCount + 1;
                  uStack_50 = 0x116991;
                  free(array);
                  return;
                }
                ppcVar6 = &local_68;
                local_60 = "0";
                local_68 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
                pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
                pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                pcVar7 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
                pcVar8 = "private_ACUtilsTest_ADynArray_reallocCount";
                iVar2 = 0x606;
              }
            }
            goto LAB_00116b98;
          }
          pcVar3 = "\"";
        }
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar8 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar4 = "destArray.buffer == \"0123\"";
        pcVar7 = "destArray.buffer";
        iVar2 = 0x600;
        local_58 = "\"";
        local_60 = "0123";
        local_68 = "\"";
        pcStack_70 = "\"0123\"";
        ppcVar5 = &pcStack_80;
        pcStack_78 = pcVar3;
        goto LAB_00116ae3;
      }
      local_60 = "8";
      pcVar4 = "destArray.capacity == 8";
      pcVar7 = "destArray.capacity";
      iVar2 = 0x5fe;
      local_58 = (char *)0x8;
      pcVar3 = (char *)destArray.capacity;
    }
    else {
      local_60 = "5";
      pcVar4 = "destArray.size == 5";
      pcVar7 = "destArray.size";
      iVar2 = 0x5fd;
      local_58 = (char *)0x5;
      pcVar3 = (char *)destArray.size;
    }
  }
  else {
    pcVar3 = (char *)(ulong)bVar1;
    local_60 = "true";
    pcVar4 = 
    "(&srcArray == ((void*)0) ? &destArray != ((void*)0) : private_ACUtils_ADynArray_insertArray(&destArray, ((size_t)-1), (&srcArray)->buffer, (&srcArray)->size, sizeof(*(&destArray)->buffer))) == true"
    ;
    pcVar7 = 
    "(&srcArray == ((void*)0) ? &destArray != ((void*)0) : private_ACUtils_ADynArray_insertArray(&destArray, ((size_t)-1), (&srcArray)->buffer, (&srcArray)->size, sizeof(*(&destArray)->buffer)))"
    ;
    iVar2 = 0x5fc;
    local_58 = (char *)0x1;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar8 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppcVar5 = &local_60;
LAB_00116ae3:
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar3;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x116aea;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar8,pcVar4,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_appendADynArray_success_zeroSizeSrcArray)
{
    struct private_ACUtilsTest_ADynArray_CharArray destArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    struct private_ACUtilsTest_ADynArray_CharArray srcArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    destArray.size = 5;
    destArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    destArray.capacity = 8;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    destArray.buffer = (char*) destArray.reallocator(nullptr, destArray.capacity);
    memcpy(destArray.buffer, "0123", 5);
    srcArray.size = 0;
    srcArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    srcArray.capacity = 8;
    srcArray.buffer = (char*) srcArray.reallocator(nullptr, srcArray.capacity);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_appendADynArray(&destArray, &srcArray), true);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.size, 5);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(destArray.buffer, "0123");
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.size, 0);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    destArray.deallocator(destArray.buffer);
    srcArray.deallocator(srcArray.buffer);
}